

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStreamReporter.cc
# Opt level: O0

void __thiscall cppmetrics::OStreamReporter::report(OStreamReporter *this)

{
  bool bVar1;
  element_type *peVar2;
  reference ppVar3;
  element_type *this_00;
  value_t vVar4;
  reference ppVar5;
  element_type *peVar6;
  element_type *this_01;
  ostream *poVar7;
  element_type *peVar8;
  long lVar9;
  element_type *peVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar11;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  undefined1 local_1d0 [8];
  shared_ptr<cppmetrics::Snapshot> snapshot_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>
  *timer;
  iterator __end1_4;
  iterator __begin1_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
  *__range1_4;
  shared_ptr<cppmetrics::Snapshot> snapshot;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>
  *histogram;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
  *__range1_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>
  *meter;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
  *__range1_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>
  *gauge;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
  *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>
  *counter;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
  *__range1;
  OStreamReporter *this_local;
  
  peVar2 = std::__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_registry);
  Registry::get_counters_abi_cxx11_((MMap<Counter> *)&__begin1,peVar2);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
                    *)&__begin1);
  counter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
                      *)&__begin1);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&counter);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>
             ::operator*(&__end1);
    poVar7 = std::operator<<(this->m_output,(string *)ppVar3);
    poVar7 = std::operator<<(poVar7,"\t");
    this_00 = std::
              __shared_ptr_access<cppmetrics::Counter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppmetrics::Counter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ppVar3->second);
    vVar4 = Counter::get_count(this_00);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,vVar4);
    std::operator<<(poVar7,"\n");
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>
    ::operator++(&__end1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
          *)&__begin1);
  peVar2 = std::__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_registry);
  Registry::get_gauges_abi_cxx11_((MMap<Gauge> *)&__begin1_1,peVar2);
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
                      *)&__begin1_1);
  gauge = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
                    *)&__begin1_1);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&gauge);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>
    ::operator*(&__end1_1);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
          *)&__begin1_1);
  peVar2 = std::__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_registry);
  Registry::get_meters_abi_cxx11_((MMap<Meter> *)&__begin1_2,peVar2);
  __end1_2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
                      *)&__begin1_2);
  meter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
                    *)&__begin1_2);
  while( true ) {
    bVar1 = std::operator!=(&__end1_2,(_Self *)&meter);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>
             ::operator*(&__end1_2);
    poVar7 = std::operator<<(this->m_output,(string *)ppVar5);
    poVar7 = std::operator<<(poVar7,".count\t");
    peVar6 = std::__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar5->second);
    lVar9 = Meter::get_count(peVar6);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,lVar9);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,(string *)ppVar5);
    poVar7 = std::operator<<(poVar7,".mean\t");
    peVar6 = std::__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar5->second);
    dVar11 = Meter::get_mean_rate(peVar6);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,(string *)ppVar5);
    poVar7 = std::operator<<(poVar7,".m1\t");
    peVar6 = std::__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar5->second);
    dVar11 = Meter::get_m1_rate(peVar6);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,(string *)ppVar5);
    poVar7 = std::operator<<(poVar7,".m5\t");
    peVar6 = std::__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar5->second);
    dVar11 = Meter::get_m5_rate(peVar6);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,(string *)ppVar5);
    poVar7 = std::operator<<(poVar7,".m15\t");
    peVar6 = std::__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Meter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar5->second);
    dVar11 = Meter::get_m15_rate(peVar6);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
    std::operator<<(poVar7,"\n");
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>
    ::operator++(&__end1_2);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
          *)&__begin1_2);
  peVar2 = std::__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_registry);
  Registry::get_histograms_abi_cxx11_((MMap<Histogram> *)&__begin1_3,peVar2);
  __end1_3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
                      *)&__begin1_3);
  histogram = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
                        *)&__begin1_3);
  while( true ) {
    bVar1 = std::operator!=(&__end1_3,(_Self *)&histogram);
    if (!bVar1) break;
    snapshot.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>
           ::operator*(&__end1_3);
    std::__shared_ptr_access<cppmetrics::Histogram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppmetrics::Histogram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&((reference)
                   snapshot.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->second);
    Histogram::get_snapshot((Histogram *)&__range1_4);
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".count\t");
    this_01 = std::
              __shared_ptr_access<cppmetrics::Histogram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppmetrics::Histogram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(snapshot.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 2));
    lVar9 = Histogram::get_count(this_01);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,lVar9);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".p75\t");
    peVar10 = std::
              __shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&__range1_4);
    (*peVar10->_vptr_Snapshot[10])();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,extraout_XMM0_Qa);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".p95\t");
    peVar10 = std::
              __shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&__range1_4);
    (*peVar10->_vptr_Snapshot[0xb])();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,extraout_XMM0_Qa_00);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".p99\t");
    peVar10 = std::
              __shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&__range1_4);
    (*peVar10->_vptr_Snapshot[0xd])();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,extraout_XMM0_Qa_01);
    std::operator<<(poVar7,"\n");
    std::shared_ptr<cppmetrics::Snapshot>::~shared_ptr
              ((shared_ptr<cppmetrics::Snapshot> *)&__range1_4);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>
    ::operator++(&__end1_3);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
          *)&__begin1_3);
  peVar2 = std::__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_registry);
  Registry::get_timers_abi_cxx11_((MMap<Timer> *)&__begin1_4,peVar2);
  __end1_4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
                      *)&__begin1_4);
  timer = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
                    *)&__begin1_4);
  while( true ) {
    bVar1 = std::operator!=(&__end1_4,(_Self *)&timer);
    if (!bVar1) break;
    snapshot_1.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>
            ::operator*(&__end1_4);
    std::__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &((reference)
                snapshot_1.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->second);
    Timer::get_snapshot((Timer *)local_1d0);
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot_1.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".count\t");
    peVar8 = std::__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(snapshot_1.
                            super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 2));
    lVar9 = Timer::get_count(peVar8);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,lVar9);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot_1.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".m1\t");
    peVar8 = std::__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(snapshot_1.
                            super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 2));
    dVar11 = Timer::get_m1_rate(peVar8);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot_1.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".m5\t");
    peVar8 = std::__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(snapshot_1.
                            super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 2));
    dVar11 = Timer::get_m5_rate(peVar8);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot_1.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".m15\t");
    peVar8 = std::__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppmetrics::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(snapshot_1.
                            super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 2));
    dVar11 = Timer::get_m15_rate(peVar8);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar11);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot_1.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".p75\t");
    peVar10 = std::
              __shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1d0);
    (*peVar10->_vptr_Snapshot[10])();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,extraout_XMM0_Qa_02);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot_1.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".p95\t");
    peVar10 = std::
              __shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1d0);
    (*peVar10->_vptr_Snapshot[0xb])();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,extraout_XMM0_Qa_03);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(this->m_output,
                             (string *)
                             snapshot_1.
                             super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    poVar7 = std::operator<<(poVar7,".p99\t");
    peVar10 = std::
              __shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1d0);
    (*peVar10->_vptr_Snapshot[0xd])();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,extraout_XMM0_Qa_04);
    std::operator<<(poVar7,"\n");
    std::shared_ptr<cppmetrics::Snapshot>::~shared_ptr
              ((shared_ptr<cppmetrics::Snapshot> *)local_1d0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>
    ::operator++(&__end1_4);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
          *)&__begin1_4);
  return;
}

Assistant:

void OStreamReporter::report()
{
  for (auto&& counter : m_registry->get_counters())
  {
    m_output << counter.first << "\t" << counter.second->get_count() << "\n";
  }

  for (auto&& gauge : m_registry->get_gauges())
  {
    //m_output << counter.first << "\t" << counter.second->
  }

  for (auto&& meter : m_registry->get_meters())
  {
    m_output << meter.first << ".count\t" << meter.second->get_count() << "\n";
    m_output << meter.first << ".mean\t" << meter.second->get_mean_rate() << "\n";
    m_output << meter.first << ".m1\t" << meter.second->get_m1_rate() << "\n";
    m_output << meter.first << ".m5\t" << meter.second->get_m5_rate() << "\n";
    m_output << meter.first << ".m15\t" << meter.second->get_m15_rate() << "\n";
  }

  for (auto&& histogram : m_registry->get_histograms())
  {
    auto snapshot = histogram.second->get_snapshot();
    m_output << histogram.first << ".count\t" << histogram.second->get_count() << "\n";
    m_output << histogram.first << ".p75\t" << snapshot->get_p75() << "\n";
    m_output << histogram.first << ".p95\t" << snapshot->get_p95() << "\n";
    m_output << histogram.first << ".p99\t" << snapshot->get_p99() << "\n";
  }

  for (auto&& timer : m_registry->get_timers())
  {
    auto snapshot = timer.second->get_snapshot();
    m_output << timer.first << ".count\t" << timer.second->get_count() << "\n";
    m_output << timer.first << ".m1\t" << timer.second->get_m1_rate() << "\n";
    m_output << timer.first << ".m5\t" << timer.second->get_m5_rate() << "\n";
    m_output << timer.first << ".m15\t" << timer.second->get_m15_rate() << "\n";
    m_output << timer.first << ".p75\t" << snapshot->get_p75() << "\n";
    m_output << timer.first << ".p95\t" << snapshot->get_p95() << "\n";
    m_output << timer.first << ".p99\t" << snapshot->get_p99() << "\n";
  }
}